

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O3

Builder * __thiscall
arangodb::velocypack::Builder::closeArray
          (Builder *this,ValueLength pos,iterator indexStart,iterator indexEnd)

{
  ValueLength *pVVar1;
  unsigned_long *puVar2;
  PaddingBehavior PVar3;
  pointer pCVar4;
  ValueLength subLen;
  byte *pbVar5;
  ValueLength VVar6;
  pointer puVar7;
  byte bVar8;
  byte bVar9;
  size_t __n;
  ulong uVar10;
  bool bVar11;
  long lVar12;
  unsigned_long uVar13;
  ulong uVar14;
  ulong uVar15;
  ValueLength VVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  size_t distance;
  ulong uVar23;
  bool bVar24;
  
  lVar22 = (long)indexEnd._M_current - (long)indexStart._M_current;
  uVar23 = lVar22 >> 3;
  if (lVar22 == 8) {
    bVar11 = false;
  }
  else {
    lVar12 = indexStart._M_current[1] - *indexStart._M_current;
    bVar11 = true;
    if (((this->_pos - *indexStart._M_current) - pos == lVar12 * uVar23) &&
       (this->_pos - (indexStart._M_current[uVar23 - 1] + pos) == lVar12)) {
      lVar17 = 1;
      do {
        bVar24 = (uVar23 - 1) + (ulong)(uVar23 - 1 == 0) == lVar17;
        bVar11 = !bVar24;
        if (bVar24) break;
        lVar19 = lVar17 + 1;
        puVar2 = indexStart._M_current + lVar17;
        lVar17 = lVar17 + 1;
      } while (indexStart._M_current[lVar19] - *puVar2 == lVar12);
    }
  }
  pbVar5 = this->_start + pos;
  PVar3 = this->options->paddingBehavior;
  if (PVar3 - NoPadding < 2) {
    uVar20 = 6;
    if (uVar23 < 6) {
      uVar20 = uVar23;
    }
    if (indexEnd._M_current != indexStart._M_current) {
      uVar15 = 0;
      do {
        if (pbVar5[indexStart._M_current[uVar15]] == 0) goto LAB_00104996;
        uVar15 = uVar15 + 1;
      } while (uVar20 != uVar15);
    }
    lVar12 = this->_pos - pos;
    uVar20 = 0;
    if (bVar11 != false) {
      uVar20 = uVar23;
    }
    lVar17 = uVar20 + lVar12;
    lVar19 = (ulong)bVar11 - 7;
    bVar8 = 1;
  }
  else {
LAB_00104996:
    lVar12 = this->_pos - pos;
    bVar8 = 0;
    uVar20 = 0;
    if (bVar11 != false) {
      uVar20 = uVar23;
    }
    lVar17 = uVar20 + lVar12;
    lVar19 = 0;
  }
  uVar20 = 1;
  if ((ulong)(lVar17 + lVar19) < 0x100) {
LAB_00104a3f:
    if (bVar11 != false) goto LAB_00104a50;
LAB_00104a44:
    if (PVar3 != UsePadding) {
      bVar8 = PVar3 != UsePadding & bVar8;
      goto LAB_00104a50;
    }
LAB_00104a95:
    *pbVar5 = bVar11 * '\x04' + 5;
    uVar20 = 8;
LAB_00104b82:
    uVar18 = (uint)uVar20;
    bVar24 = true;
    uVar15 = uVar20;
    if (bVar11 == false) goto LAB_00104c6a;
  }
  else {
    if (PVar3 == NoPadding) {
      uVar20 = 4;
      if (uVar23 < 4) {
        uVar20 = uVar23;
      }
      if (indexEnd._M_current != indexStart._M_current) {
        uVar15 = 0;
        do {
          if (pbVar5[indexStart._M_current[uVar15]] == 0) goto LAB_00104a17;
          uVar15 = uVar15 + 1;
        } while (uVar20 != uVar15);
      }
      lVar17 = 0;
      if (bVar11 != false) {
        lVar17 = lVar22 >> 2;
      }
      lVar21 = (ulong)bVar11 * 2 + -6;
      lVar19 = 1;
    }
    else {
LAB_00104a17:
      lVar19 = 0;
      lVar17 = lVar22 >> 2;
      if (bVar11 == false) {
        lVar17 = lVar19;
      }
      lVar21 = 0;
    }
    bVar8 = (byte)lVar19;
    uVar20 = 2;
    if ((ulong)(lVar21 + lVar12 + lVar17) < 0x10000) goto LAB_00104a3f;
    lVar17 = 0;
    if (bVar11 != false) {
      lVar17 = lVar22 >> 1;
    }
    bVar24 = (ulong)(lVar12 + lVar17) >> 0x20 == 0;
    if (!bVar24) goto LAB_00104a95;
    bVar8 = 0;
    uVar20 = 4;
    if (bVar24 && bVar11 == false) goto LAB_00104a44;
LAB_00104a50:
    bVar9 = bVar11 * '\x04' | 2;
    if ((int)uVar20 == 4) {
      *pbVar5 = bVar9 + 2;
      uVar20 = 4;
    }
    else if ((int)uVar20 == 2) {
      *pbVar5 = bVar11 * '\x04' | 3;
      uVar20 = 2;
    }
    else {
      *pbVar5 = bVar9;
    }
    if (bVar8 == 0) goto LAB_00104b82;
    uVar18 = (uint)uVar20;
    uVar15 = 0;
    if (bVar11 == false) {
      uVar15 = uVar20;
    }
    lVar22 = (uVar20 * 2 + 1) - uVar15;
    uVar15 = this->_pos;
    __n = uVar15 - (pos + 9);
    if (pos + 9 <= uVar15 && __n != 0) {
      memmove(this->_start + pos + lVar22,this->_start + pos + 9,__n);
      uVar15 = this->_pos;
    }
    lVar22 = 9 - lVar22;
    this->_pos = uVar15 - lVar22;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 - lVar22;
    bVar24 = true;
    uVar15 = uVar20;
    if (bVar11 == false) goto LAB_00104c6a;
    if (indexEnd._M_current != indexStart._M_current) {
      lVar12 = 0;
      do {
        indexStart._M_current[lVar12] = indexStart._M_current[lVar12] - lVar22;
        lVar12 = lVar12 + 1;
      } while (uVar23 + (uVar23 == 0) != lVar12);
      goto LAB_00104b82;
    }
  }
  lVar22 = uVar23 * uVar15;
  reserve(this,(ulong)(uVar18 == 8) * 8 + lVar22);
  VVar6 = this->_pos;
  this->_pos = VVar6 + lVar22;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + lVar22;
  if (indexEnd._M_current != indexStart._M_current) {
    lVar22 = 0;
    do {
      uVar13 = indexStart._M_current[lVar22];
      VVar16 = VVar6;
      uVar20 = uVar15;
      do {
        this->_start[VVar16] = (uint8_t)uVar13;
        uVar13 = uVar13 >> 8;
        VVar16 = VVar16 + 1;
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
      lVar22 = lVar22 + 1;
      VVar6 = VVar6 + uVar15;
    } while (lVar22 != uVar23 + (uVar23 == 0));
  }
  uVar20 = (ulong)uVar18;
  if (uVar18 == 8) {
    lVar22 = 8;
    reserve(this,8);
    uVar20 = uVar23;
    do {
      VVar6 = this->_pos;
      this->_pos = VVar6 + 1;
      this->_start[VVar6] = (uint8_t)uVar20;
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 + 1;
      uVar20 = uVar20 >> 8;
      lVar22 = lVar22 + -1;
    } while (lVar22 != 0);
    bVar24 = false;
    uVar20 = 8;
  }
  else {
    bVar24 = false;
  }
LAB_00104c6a:
  uVar10 = this->_pos - pos;
  uVar14 = uVar20;
  VVar6 = pos;
  do {
    this->_start[VVar6 + 1] = (uint8_t)uVar10;
    uVar10 = uVar10 >> 8;
    VVar6 = VVar6 + 1;
    uVar14 = uVar14 - 1;
  } while (uVar14 != 0);
  if ((uint)uVar20 < 8 && !bVar24) {
    do {
      this->_start[uVar15 + pos + 1] = (uint8_t)uVar23;
      uVar15 = uVar15 + 1;
      uVar23 = uVar23 >> 8;
    } while (uVar15 < (uint)uVar20 * 2);
  }
  pCVar4 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  VVar6 = pCVar4[-1].indexStartPos;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = pCVar4 + -1;
  puVar7 = (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + VVar6;
  if (puVar7 != (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
  }
  return this;
}

Assistant:

Builder& Builder::closeArray(ValueLength pos,
                             std::vector<ValueLength>::iterator indexStart,
                             std::vector<ValueLength>::iterator indexEnd) {
  std::size_t const n = std::distance(indexStart, indexEnd);
  VELOCYPACK_ASSERT(n > 0);

  bool needIndexTable = true;
  bool needNrSubs = true;

  if (n == 1) {
    // just one array entry
    needIndexTable = false;
    needNrSubs = false;
  } else if ((_pos - pos) - indexStart[0] ==
             n * (indexStart[1] - indexStart[0])) {
    // In this case it could be that all entries have the same length
    // and we do not need an offset table at all:
    bool buildIndexTable = false;
    ValueLength const subLen = indexStart[1] - indexStart[0];
    if ((_pos - pos) - indexStart[n - 1] != subLen) {
      buildIndexTable = true;
    } else {
      for (std::size_t i = 1; i < n - 1; i++) {
        if (indexStart[i + 1] - indexStart[i] != subLen) {
          // different lengths
          buildIndexTable = true;
          break;
        }
      }
    }

    if (!buildIndexTable) {
      needIndexTable = false;
      needNrSubs = false;
    }
  }

  VELOCYPACK_ASSERT(needIndexTable == needNrSubs);

  // First determine byte length and its format:
  unsigned int offsetSize;
  // can be 1, 2, 4 or 8 for the byte width of the offsets,
  // the byte length and the number of subvalues:
  bool allowMemmove =
      ::isAllowedToMemmove(options, _start + pos, indexStart, indexEnd, 1);
  if (_pos - pos + (needIndexTable ? n : 0) -
          (allowMemmove ? (needNrSubs ? 6 : 7) : 0) <=
      0xff) {
    // We have so far used _pos - pos bytes, including the reserved 8
    // bytes for byte length and number of subvalues. In the 1-byte number
    // case we would win back 6 bytes but would need one byte per subvalue
    // for the index table
    offsetSize = 1;
  } else {
    allowMemmove =
        ::isAllowedToMemmove(options, _start + pos, indexStart, indexEnd, 2);
    if (_pos - pos + (needIndexTable ? 2 * n : 0) -
            (allowMemmove ? (needNrSubs ? 4 : 6) : 0) <=
        0xffff) {
      offsetSize = 2;
    } else {
      allowMemmove = false;
      if (_pos - pos + (needIndexTable ? 4 * n : 0) <= 0xffffffffu) {
        offsetSize = 4;
      } else {
        offsetSize = 8;
      }
    }
  }

  VELOCYPACK_ASSERT(offsetSize == 1 || offsetSize == 2 || offsetSize == 4 ||
                    offsetSize == 8);
  VELOCYPACK_ASSERT(!allowMemmove || offsetSize == 1 || offsetSize == 2);

  if (offsetSize < 8 && !needIndexTable &&
      options->paddingBehavior == Options::PaddingBehavior::UsePadding) {
    // if we are allowed to use padding, we will pad to 8 bytes anyway. as we
    // are not using an index table, we can also use type 0x05 for all Arrays
    // without making things worse space-wise
    offsetSize = 8;
    allowMemmove = false;
  }

  // fix head byte
  _start[pos] = ::determineArrayType(needIndexTable, offsetSize);

  // Maybe we need to move down data:
  if (allowMemmove) {
    // check if one of the first entries in the array is ValueType::None
    // (0x00). in this case, we could not distinguish between a None (0x00)
    // and the optional padding. so we must prevent the memmove here
    ValueLength targetPos = 1 + 2 * offsetSize;
    if (!needIndexTable) {
      targetPos -= offsetSize;
    }
    if (_pos > (pos + 9)) {
      ValueLength len = _pos - (pos + 9);
      memmove(_start + pos + targetPos, _start + pos + 9, checkOverflow(len));
    }
    ValueLength const diff = 9 - targetPos;
    rollback(diff);
    if (needIndexTable) {
      for (std::size_t i = 0; i < n; i++) {
        indexStart[i] -= diff;
      }
    }  // Note: if !needIndexTable the index array is now wrong!
  }

  // Now build the table:
  if (needIndexTable) {
    reserve(offsetSize * n + (offsetSize == 8 ? 8 : 0));
    ValueLength tableBase = _pos;
    advance(offsetSize * n);
    for (std::size_t i = 0; i < n; i++) {
      uint64_t x = indexStart[i];
      for (std::size_t j = 0; j < offsetSize; j++) {
        _start[tableBase + offsetSize * i + j] = x & 0xff;
        x >>= 8;
      }
    }
  }

  // Finally fix the byte width at tthe end:
  if (offsetSize == 8 && needNrSubs) {
    reserve(8);
    appendLengthUnchecked<8>(n);
  }

  // Fix the byte length in the beginning:
  ValueLength x = _pos - pos;
  for (unsigned int i = 1; i <= offsetSize; i++) {
    _start[pos + i] = x & 0xff;
    x >>= 8;
  }

  if (offsetSize < 8 && needNrSubs) {
    x = n;
    for (unsigned int i = offsetSize + 1; i <= 2 * offsetSize; i++) {
      _start[pos + i] = x & 0xff;
      x >>= 8;
    }
  }

  // Now the array or object is complete, we pop a ValueLength
  // off the _stack:
  closeLevel();
  return *this;
}